

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode Curl_smtp_escape_eob(connectdata *conn,ssize_t nread)

{
  Curl_easy *data;
  void *pvVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  undefined1 uVar9;
  long lVar10;
  long lVar11;
  char *local_60;
  
  data = conn->data;
  pvVar1 = (data->req).protop;
  local_60 = (data->state).scratch;
  if ((local_60 == (char *)0x0) || ((data->set).crlf == true)) {
    pcVar3 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size * 2);
    pcVar7 = local_60;
    local_60 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      Curl_failf(data,"Failed to alloc scratch buffer!");
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    pcVar3 = (char *)0x0;
    pcVar7 = (char *)0x0;
  }
  lVar10 = *(long *)((long)pvVar1 + 0x18);
  lVar11 = 0;
  lVar5 = 0;
  if (0 < nread) {
    lVar5 = nread;
  }
  lVar8 = 0;
  do {
    lVar2 = *(long *)((long)pvVar1 + 0x18);
    if (lVar5 == lVar8) {
      if (lVar2 - lVar10 != 0) {
        memcpy(local_60 + lVar11,"\r\n.\r\n" + lVar10,lVar2 - lVar10);
        lVar11 = (lVar11 - lVar10) + *(long *)((long)pvVar1 + 0x18);
      }
      if (lVar11 == nread) {
        (*Curl_cfree)(pcVar3);
      }
      else {
        (data->req).upload_fromhere = local_60;
        (data->state).scratch = local_60;
        (*Curl_cfree)(pcVar7);
        (data->req).upload_present = lVar11;
      }
      return CURLE_OK;
    }
    pcVar4 = (data->req).upload_fromhere;
    if ("\r\n.\r\n"[lVar2] == pcVar4[lVar8]) {
      uVar6 = lVar2 + 1;
      *(ulong *)((long)pvVar1 + 0x18) = uVar6;
      uVar9 = 1;
      if ((lVar2 != 1) && (lVar2 != 4)) {
        uVar9 = 0;
      }
LAB_00133339:
      *(undefined1 *)((long)pvVar1 + 0x20) = uVar9;
      if (uVar6 == 0) goto LAB_00133383;
      if (uVar6 == 3) {
        memcpy(local_60 + lVar11,"\r\n.." + lVar10,4U - lVar10);
        lVar11 = lVar11 + (4U - lVar10);
        *(undefined8 *)((long)pvVar1 + 0x18) = 0;
        lVar10 = 0;
      }
    }
    else {
      if (lVar2 != 0) {
        memcpy(local_60 + lVar11,"\r\n.\r\n" + lVar10,lVar2 - lVar10);
        lVar11 = (lVar11 - lVar10) + *(long *)((long)pvVar1 + 0x18);
        pcVar4 = (data->req).upload_fromhere;
        uVar6 = (ulong)(pcVar4[lVar8] == '\r');
        *(ulong *)((long)pvVar1 + 0x18) = uVar6;
        uVar9 = 0;
        lVar10 = 0;
        goto LAB_00133339;
      }
LAB_00133383:
      local_60[lVar11] = pcVar4[lVar8];
      lVar11 = lVar11 + 1;
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_smtp_escape_eob(struct connectdata *conn, const ssize_t nread)
{
  /* When sending a SMTP payload we must detect CRLF. sequences making sure
     they are sent as CRLF.. instead, as a . on the beginning of a line will
     be deleted by the server when not part of an EOB terminator and a
     genuine CRLF.CRLF which isn't escaped will wrongly be detected as end of
     data by the server
  */
  ssize_t i;
  ssize_t si;
  struct Curl_easy *data = conn->data;
  struct SMTP *smtp = data->req.protop;
  char *scratch = data->state.scratch;
  char *newscratch = NULL;
  char *oldscratch = NULL;
  size_t eob_sent;

  /* Do we need to allocate a scratch buffer? */
  if(!scratch || data->set.crlf) {
    oldscratch = scratch;

    scratch = newscratch = malloc(2 * data->set.upload_buffer_size);
    if(!newscratch) {
      failf(data, "Failed to alloc scratch buffer!");

      return CURLE_OUT_OF_MEMORY;
    }
  }
  DEBUGASSERT(data->set.upload_buffer_size >= (size_t)nread);

  /* Have we already sent part of the EOB? */
  eob_sent = smtp->eob;

  /* This loop can be improved by some kind of Boyer-Moore style of
     approach but that is saved for later... */
  for(i = 0, si = 0; i < nread; i++) {
    if(SMTP_EOB[smtp->eob] == data->req.upload_fromhere[i]) {
      smtp->eob++;

      /* Is the EOB potentially the terminating CRLF? */
      if(2 == smtp->eob || SMTP_EOB_LEN == smtp->eob)
        smtp->trailing_crlf = TRUE;
      else
        smtp->trailing_crlf = FALSE;
    }
    else if(smtp->eob) {
      /* A previous substring matched so output that first */
      memcpy(&scratch[si], &SMTP_EOB[eob_sent], smtp->eob - eob_sent);
      si += smtp->eob - eob_sent;

      /* Then compare the first byte */
      if(SMTP_EOB[0] == data->req.upload_fromhere[i])
        smtp->eob = 1;
      else
        smtp->eob = 0;

      eob_sent = 0;

      /* Reset the trailing CRLF flag as there was more data */
      smtp->trailing_crlf = FALSE;
    }

    /* Do we have a match for CRLF. as per RFC-5321, sect. 4.5.2 */
    if(SMTP_EOB_FIND_LEN == smtp->eob) {
      /* Copy the replacement data to the target buffer */
      memcpy(&scratch[si], &SMTP_EOB_REPL[eob_sent],
             SMTP_EOB_REPL_LEN - eob_sent);
      si += SMTP_EOB_REPL_LEN - eob_sent;
      smtp->eob = 0;
      eob_sent = 0;
    }
    else if(!smtp->eob)
      scratch[si++] = data->req.upload_fromhere[i];
  }

  if(smtp->eob - eob_sent) {
    /* A substring matched before processing ended so output that now */
    memcpy(&scratch[si], &SMTP_EOB[eob_sent], smtp->eob - eob_sent);
    si += smtp->eob - eob_sent;
  }

  /* Only use the new buffer if we replaced something */
  if(si != nread) {
    /* Upload from the new (replaced) buffer instead */
    data->req.upload_fromhere = scratch;

    /* Save the buffer so it can be freed later */
    data->state.scratch = scratch;

    /* Free the old scratch buffer */
    free(oldscratch);

    /* Set the new amount too */
    data->req.upload_present = si;
  }
  else
    free(newscratch);

  return CURLE_OK;
}